

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.h
# Opt level: O0

void __thiscall sing::HttpRequest::reset(HttpRequest *this)

{
  HttpRequest *this_local;
  
  this->method = Invalid;
  this->version = Unknown;
  std::__cxx11::string::operator=((string *)&this->path,"");
  std::__cxx11::string::operator=((string *)&this->query,"");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->headers);
  return;
}

Assistant:

void reset(){
        method = Invalid;
        version = Unknown;
        path = "";
        query = "";
        headers.clear();
    }